

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::ConvertToSampledImagePass::Process(ConvertToSampledImagePass *this)

{
  bool bVar1;
  Status SVar2;
  iterator iVar3;
  Status SVar4;
  __node_base _Var5;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_image;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler;
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_90;
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = &local_90._M_single_bucket;
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = CollectResourcesToConvert
                    (this,(DescriptorSetBindingToInstruction *)&local_58,
                     (DescriptorSetBindingToInstruction *)&local_90);
  if (bVar1) {
    SVar4 = SuccessWithoutChange;
    for (_Var5._M_nxt = local_90._M_before_begin._M_nxt; _Var5._M_nxt != (_Hash_node_base *)0x0;
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
      SVar2 = UpdateImageVariableToSampledImage
                        (this,(Instruction *)_Var5._M_nxt[2]._M_nxt,
                         (DescriptorSetAndBinding *)(_Var5._M_nxt + 1));
      if ((int)SVar2 < (int)SVar4) {
        SVar4 = SVar2;
      }
      if (SVar4 == Failure) goto LAB_00545894;
    }
    if (local_58._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var5._M_nxt = local_58._M_before_begin._M_nxt;
      do {
        iVar3 = std::
                _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_90,(key_type *)(_Var5._M_nxt + 1));
        if ((iVar3.
             super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(Instruction **)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                    ._M_cur + 0x10) == (Instruction *)0x0)) goto LAB_00545894;
        SVar2 = CheckUsesOfSamplerVariable
                          (this,(Instruction *)_Var5._M_nxt[2]._M_nxt,
                           *(Instruction **)
                            ((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                                   ._M_cur + 0x10));
        if ((int)SVar2 < (int)SVar4) {
          SVar4 = SVar2;
        }
        if (SVar4 == Failure) goto LAB_00545894;
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
      } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
    }
  }
  else {
LAB_00545894:
    SVar4 = Failure;
  }
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_90);
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,_std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_58);
  return SVar4;
}

Assistant:

Pass::Status ConvertToSampledImagePass::Process() {
  Status status = Status::SuccessWithoutChange;

  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler,
      descriptor_set_binding_pair_to_image;
  if (!CollectResourcesToConvert(&descriptor_set_binding_pair_to_sampler,
                                 &descriptor_set_binding_pair_to_image)) {
    return Status::Failure;
  }

  for (auto& image : descriptor_set_binding_pair_to_image) {
    status = CombineStatus(
        status, UpdateImageVariableToSampledImage(image.second, image.first));
    if (status == Status::Failure) {
      return status;
    }
  }

  for (const auto& sampler : descriptor_set_binding_pair_to_sampler) {
    // Converting only a Sampler to Sampled Image is not allowed. It must have a
    // corresponding image to combine the sampler with.
    auto image_itr = descriptor_set_binding_pair_to_image.find(sampler.first);
    if (image_itr == descriptor_set_binding_pair_to_image.end() ||
        image_itr->second == nullptr) {
      return Status::Failure;
    }

    status = CombineStatus(
        status, CheckUsesOfSamplerVariable(sampler.second, image_itr->second));
    if (status == Status::Failure) {
      return status;
    }
  }

  return status;
}